

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testRunStarting
          (StreamingReporterBase<Catch::CompactReporter> *this,TestRunInfo *_testRunInfo)

{
  Option<Catch::TestRunInfo>::operator=
            (&(this->currentTestRunInfo).super_Option<Catch::TestRunInfo>,_testRunInfo);
  (this->currentTestRunInfo).used = false;
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }